

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode socket_write(UA_Connection *connection,UA_ByteString *buf)

{
  ssize_t sVar1;
  int *piVar2;
  size_t bytes_to_send;
  ssize_t n;
  size_t nWritten;
  UA_ByteString *buf_local;
  UA_Connection *connection_local;
  
  n = 0;
  while (((sVar1 = send(connection->sockfd,buf->data + n,buf->length - n,0), -1 < sVar1 ||
          (piVar2 = __errno_location(), *piVar2 == 4)) ||
         (piVar2 = __errno_location(), *piVar2 == 0xb))) {
    if ((-1 < sVar1) && (n = sVar1 + n, buf->length <= (ulong)n)) {
      UA_ByteString_deleteMembers(buf);
      return 0;
    }
  }
  (*connection->close)(connection);
  socket_close(connection);
  UA_ByteString_deleteMembers(buf);
  return 0x80ae0000;
}

Assistant:

static UA_StatusCode
socket_write(UA_Connection *connection, UA_ByteString *buf) {
    size_t nWritten = 0;
    do {
        ssize_t n = 0;
        do {
        /* If the OS throws EMSGSIZE, force a smaller packet size:
         * size_t bytes_to_send = buf->length - nWritten >  1024 ? 1024 : buf->length - nWritten; */
            size_t bytes_to_send = buf->length - nWritten;
            n = send((SOCKET)connection->sockfd, (const char*)buf->data + nWritten,
                     WIN32_INT bytes_to_send, 0);
            if(n < 0 && errno__ != INTERRUPTED && errno__ != AGAIN) {
                connection->close(connection);
                socket_close(connection);
                UA_ByteString_deleteMembers(buf);
                return UA_STATUSCODE_BADCONNECTIONCLOSED;
            }
        } while(n < 0);
        nWritten += (size_t)n;
    } while(nWritten < buf->length);
    UA_ByteString_deleteMembers(buf);
    return UA_STATUSCODE_GOOD;
}